

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IMutableContext * Catch::getCurrentMutableContext(void)

{
  if ((anonymous_namespace)::currentContext == (IMutableContext *)0x0) {
    (anonymous_namespace)::currentContext = (IMutableContext *)operator_new(0x50);
    ((anonymous_namespace)::currentContext->super_IContext)._vptr_IContext =
         (_func_int **)&PTR__Context_0017e440;
    *(undefined4 *)&(anonymous_namespace)::currentContext[5].super_IContext._vptr_IContext = 0;
    (anonymous_namespace)::currentContext[6].super_IContext._vptr_IContext = (_func_int **)0x0;
    (anonymous_namespace)::currentContext[1].super_IContext._vptr_IContext = (_func_int **)0x0;
    (anonymous_namespace)::currentContext[2].super_IContext._vptr_IContext = (_func_int **)0x0;
    (anonymous_namespace)::currentContext[3].super_IContext._vptr_IContext = (_func_int **)0x0;
    (anonymous_namespace)::currentContext[7].super_IContext._vptr_IContext =
         (_func_int **)((anonymous_namespace)::currentContext + 5);
    (anonymous_namespace)::currentContext[8].super_IContext._vptr_IContext =
         (_func_int **)((anonymous_namespace)::currentContext + 5);
    (anonymous_namespace)::currentContext[9].super_IContext._vptr_IContext = (_func_int **)0x0;
  }
  return (anonymous_namespace)::currentContext;
}

Assistant:

IMutableContext& getCurrentMutableContext() {
        if( !currentContext )
            currentContext = new Context();
        return *currentContext;
    }